

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFATokenizer.h
# Opt level: O2

void __thiscall
SGParser::DFATokenizer<SGParser::GenericToken>::DFATokenizer
          (DFATokenizer<SGParser::GenericToken> *this,DFA *pdfa,InputStream *pinputStream)

{
  (this->super_TokenizerImpl<SGParser::GenericToken>).TailPos.Line = 0;
  (this->super_TokenizerImpl<SGParser::GenericToken>).TailPos.Offset = 0;
  (this->super_TokenizerImpl<SGParser::GenericToken>).HeadPos.Line = 0;
  (this->super_TokenizerImpl<SGParser::GenericToken>).HeadPos.Offset = 0;
  (this->super_TokenizerImpl<SGParser::GenericToken>).super_TokenizerBase.pFreeBuffer =
       (TokenizerBuffer *)0x0;
  (this->super_TokenizerImpl<SGParser::GenericToken>).super_TokenizerBase.pInputStream =
       (InputStream *)0x0;
  (this->super_TokenizerImpl<SGParser::GenericToken>).super_TokenizerBase.pTail = (char *)0x0;
  (this->super_TokenizerImpl<SGParser::GenericToken>).super_TokenizerBase.pTailBuffer =
       (TokenizerBuffer *)0x0;
  (this->super_TokenizerImpl<SGParser::GenericToken>).super_TokenizerBase.pHead = (char *)0x0;
  (this->super_TokenizerImpl<SGParser::GenericToken>).super_TokenizerBase.pHeadBuffer =
       (TokenizerBuffer *)0x0;
  (this->super_TokenizerImpl<SGParser::GenericToken>).super_TokenStream<SGParser::GenericToken>.
  _vptr_TokenStream = (_func_int **)&PTR__DFATokenizer_0010fcd0;
  this->pDFA = (DFA *)0x0;
  this->ExpressionStackTop = 0xffff;
  (this->ExpressionStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ExpressionStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ExpressionStack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Create(this,pdfa,pinputStream);
  return;
}

Assistant:

explicit DFATokenizer(const DFA* pdfa, InputStream* pinputStream = nullptr) {
        Create(pdfa, pinputStream);
    }